

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopedTransaction.cpp
# Opt level: O0

void __thiscall f8n::db::ScopedTransaction::CommitAndRestart(ScopedTransaction *this)

{
  ScopedTransaction *this_local;
  
  End(this);
  Begin(this);
  return;
}

Assistant:

void ScopedTransaction::CommitAndRestart() {
    this->End();
    this->Begin();
}